

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O0

char * fruitname(boolean juice)

{
  char *__s;
  char *pcVar1;
  char *pcVar2;
  char *local_20;
  char *fruit_nam;
  char *buf;
  boolean juice_local;
  
  __s = nextobuf();
  local_20 = strstri(pl_fruit," of ");
  if (local_20 == (char *)0x0) {
    local_20 = pl_fruit;
  }
  else {
    local_20 = local_20 + 4;
  }
  pcVar1 = makesingular(local_20);
  pcVar2 = "";
  if (juice != '\0') {
    pcVar2 = " juice";
  }
  sprintf(__s,"%s%s",pcVar1,pcVar2);
  return __s;
}

Assistant:

char *fruitname(boolean juice)
{
    char *buf = nextobuf();
    const char *fruit_nam = strstri(pl_fruit, " of ");

    if (fruit_nam)
	fruit_nam += 4;		/* skip past " of " */
    else
	fruit_nam = pl_fruit;	/* use it as is */

    sprintf(buf, "%s%s", makesingular(fruit_nam), juice ? " juice" : "");
    return buf;
}